

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *os_;
  int iVar3;
  undefined1 local_548 [8];
  Parg pg;
  ostream os;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  allocator<char> local_48 [39];
  allocator<char> local_21;
  
  OB::Parg::Parg((Parg *)local_548,argc,argv);
  iVar2 = program_options((Parg *)local_548);
  iVar3 = 0;
  if (0 < iVar2) goto LAB_00104d4a;
  if (iVar2 < 0) {
    iVar3 = 1;
    goto LAB_00104d4a;
  }
  OB::Term::ostream::ostream
            ((ostream *)
             &pg.similar_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cout,2,
             0xffffffffffffffff);
  os.super_ostream._96_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"line-wrap",local_48);
  bVar1 = OB::Parg::get<bool>((Parg *)local_548,&local_68);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_68);
LAB_00104b44:
    os.super_ostream._96_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"auto-wrap",local_48);
    os.super_ostream._98_1_ = OB::Parg::get<bool>((Parg *)local_548,&local_128);
    os.super_ostream._120_8_ = 0;
    *(undefined1 *)os.super_ostream._112_8_ = 0;
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"first-wrap",local_48);
    bVar1 = OB::Parg::get<bool>((Parg *)local_548,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if (bVar1) {
      os.super_ostream._97_1_ = 0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"width",local_48);
    bVar1 = OB::Parg::find((Parg *)local_548,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"width",local_48);
      os.super_ostream._72_8_ = OB::Parg::get<unsigned_long>((Parg *)local_548,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      bVar1 = OB::Term::is_term(1);
      if (bVar1) {
        os.super_ostream._72_8_ = OB::Term::width(1);
      }
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&os.field_0x1d8,"auto-wrap",&local_21);
    bVar1 = OB::Parg::get<bool>((Parg *)local_548,(string *)&os.field_0x1d8);
    std::__cxx11::string::~string((string *)&os.field_0x1d8);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) goto LAB_00104b44;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"ansi",local_48);
  bVar1 = OB::Parg::get<bool>((Parg *)local_548,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (!bVar1) {
    os.super_ostream._101_1_ = 0;
    os.super_ostream._184_8_ = 0;
    *(undefined1 *)os.super_ostream._176_8_ = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"white-space",local_48);
  bVar1 = OB::Parg::get<bool>((Parg *)local_548,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (!bVar1) {
    os.super_ostream._100_1_ = 0;
  }
  std::__cxx11::string::string
            ((string *)local_48,
             (string *)
             &pg.positional_vec_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  os_ = std::operator<<((ostream *)
                        &pg.similar_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_48);
  OB::Term::iomanip::operator<<(os_,(flush *)&local_21);
  std::__cxx11::string::~string((string *)local_48);
  OB::Term::ostream::~ostream
            ((ostream *)
             &pg.similar_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00104d4a:
  OB::Parg::~Parg((Parg *)local_548);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
  Parg pg {argc, argv};
  int pstatus {program_options(pg)};
  if (pstatus > 0) return 0;
  if (pstatus < 0) return 1;

  try
  {
    OB::Term::ostream os {std::cout};

    os.line_wrap(false);

    if (pg.get<bool>("line-wrap") || pg.get<bool>("auto-wrap"))
    {
      os.line_wrap(true);
      os.auto_wrap(pg.get<bool>("auto-wrap"));

      if (pg.get<bool>("first-wrap"))
      {
        os.first_wrap(false);
      }

      if (pg.find("width"))
      {
        os.width(pg.get<std::size_t>("width"));
      }
      else
      {
        if (OB::Term::is_term(STDOUT_FILENO))
        {
          os.width(OB::Term::width(STDOUT_FILENO));
        }
      }
    }

    if (! pg.get<bool>("ansi"))
    {
      os.escape_codes(false);
    }

    if (! pg.get<bool>("white-space"))
    {
      os.white_space(false);
    }

    os
    << pg.get_stdin()
    << OB::Term::iomanip::flush();
  }
  catch(std::exception const& e)
  {
    std::cerr << "Error: " << e.what() << "\n";
  }
  catch(...)
  {
    std::cerr << "Error: an unexpected error occurred\n";
  }

  return 0;
}